

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_restart.c
# Opt level: O0

cupdlp_bool PDHG_Check_Restart_Merit_Function(CUPDLPwork *work)

{
  CUPDLPresobj *pCVar1;
  bool local_31;
  CUPDLPresobj *resobj;
  CUPDLPiterates *iterates;
  CUPDLPstepsize *stepsize;
  CUPDLPdata *lp;
  CUPDLPproblem *problem;
  CUPDLPwork *work_local;
  
  pCVar1 = work->resobj;
  local_31 = false;
  if (ABS(pCVar1->dDualityGapAverage) * 2.0 < ABS(pCVar1->dDualityGap)) {
    local_31 = pCVar1->dPrimalFeasAverage * 2.0 < pCVar1->dPrimalFeas;
  }
  return local_31;
}

Assistant:

cupdlp_bool PDHG_Check_Restart_Merit_Function(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;
  CUPDLPresobj *resobj = work->resobj;

  return (
      (fabs(resobj->dDualityGap) > 2.0 * fabs(resobj->dDualityGapAverage)) &&
      (resobj->dPrimalFeas > 2.0 * resobj->dPrimalFeasAverage));
}